

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::Image::ImageTests::ImageTests
          (ImageTests *this,EglTestContext *eglTestCtx,string *name,string *desc)

{
  char *name_00;
  char *description;
  string *desc_local;
  string *name_local;
  EglTestContext *eglTestCtx_local;
  ImageTests *this_local;
  
  name_00 = (char *)std::__cxx11::string::c_str();
  description = (char *)std::__cxx11::string::c_str();
  TestCaseGroup::TestCaseGroup(&this->super_TestCaseGroup,eglTestCtx,name_00,description);
  (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ImageTests_00677ac8;
  LabeledActions::LabeledActions(&this->m_createActions);
  return;
}

Assistant:

ImageTests						(EglTestContext& eglTestCtx, const string& name, const string& desc)
						: TestCaseGroup(eglTestCtx, name.c_str(), desc.c_str()) {}